

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcCartesianPoint::~IfcCartesianPoint(IfcCartesianPoint *this)

{
  void *pvVar1;
  
  *(undefined ***)&this[-1].super_IfcPoint.field_0x40 = &PTR__IfcCartesianPoint_0096e240;
  *(undefined ***)&(this->super_IfcPoint).super_IfcGeometricRepresentationItem.field_0x28 =
       &PTR__IfcCartesianPoint_0096e2e0;
  *(undefined ***)&this[-1].field_0x50 = &PTR__IfcCartesianPoint_0096e268;
  *(undefined ***)&this[-1].field_0x60 = &PTR__IfcCartesianPoint_0096e290;
  (this->super_IfcPoint).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcCartesianPoint_0096e2b8;
  pvVar1 = *(void **)&(this->super_IfcPoint).super_IfcGeometricRepresentationItem.
                      super_IfcRepresentationItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                      field_0x10;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->super_IfcPoint).super_IfcGeometricRepresentationItem.
                                     super_IfcRepresentationItem.
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                     .field_0x20 - (long)pvVar1);
    return;
  }
  return;
}

Assistant:

IfcCartesianPoint() : Object("IfcCartesianPoint") {}